

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFormatParser.cpp
# Opt level: O0

int main(void)

{
  ulong uVar1;
  size_t bytes_19;
  size_t bytes_18;
  size_t bytes_17;
  size_t bytes_16;
  size_t bytes_15;
  size_t bytes_14;
  size_t bytes_13;
  size_t bytes_12;
  size_t bytes_11;
  size_t bytes_10;
  size_t bytes_9;
  size_t bytes_8;
  size_t bytes_7;
  size_t bytes_6;
  size_t bytes_5;
  size_t bytes_4;
  size_t bytes_3;
  size_t bytes_2;
  size_t bytes_1;
  size_t bytes;
  allocator local_3d1;
  string local_3d0 [32];
  ulong local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  ulong local_380;
  allocator local_371;
  string local_370 [32];
  ulong local_350;
  allocator local_341;
  string local_340 [32];
  ulong local_320;
  allocator local_311;
  string local_310 [32];
  ulong local_2f0;
  allocator local_2e1;
  string local_2e0 [32];
  ulong local_2c0;
  allocator local_2b1;
  string local_2b0 [32];
  ulong local_290;
  allocator local_281;
  string local_280 [32];
  ulong local_260;
  allocator local_251;
  string local_250 [32];
  ulong local_230;
  allocator local_221;
  string local_220 [32];
  ulong local_200;
  allocator local_1f1;
  string local_1f0 [32];
  ulong local_1d0;
  allocator local_1c1;
  string local_1c0 [32];
  ulong local_1a0;
  allocator local_191;
  string local_190 [32];
  ulong local_170;
  allocator local_161;
  string local_160 [32];
  ulong local_140;
  allocator local_131;
  string local_130 [32];
  ulong local_110;
  allocator local_101;
  string local_100 [32];
  ulong local_e0;
  allocator local_d1;
  string local_d0 [32];
  ulong local_b0;
  allocator local_a1;
  string local_a0 [32];
  ulong local_80;
  allocator local_71;
  string local_70 [32];
  ulong local_50;
  allocator local_31;
  string local_30 [32];
  ulong local_10;
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"CF64",&local_31);
  uVar1 = SoapySDR::formatToSize(local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = uVar1;
  printf("%s -> %d bytes/element\t","CF64",uVar1 & 0xffffffff);
  if (local_10 == 0x10) {
    printf("OK\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"CF32",&local_71);
    uVar1 = SoapySDR::formatToSize(local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_50 = uVar1;
    printf("%s -> %d bytes/element\t","CF32",uVar1 & 0xffffffff);
    if (local_50 == 8) {
      printf("OK\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"CS32",&local_a1);
      uVar1 = SoapySDR::formatToSize(local_a0);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      local_80 = uVar1;
      printf("%s -> %d bytes/element\t","CS32",uVar1 & 0xffffffff);
      if (local_80 == 8) {
        printf("OK\n");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"CU32",&local_d1);
        uVar1 = SoapySDR::formatToSize(local_d0);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        local_b0 = uVar1;
        printf("%s -> %d bytes/element\t","CU32",uVar1 & 0xffffffff);
        if (local_b0 == 8) {
          printf("OK\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_100,"CS16",&local_101);
          uVar1 = SoapySDR::formatToSize(local_100);
          std::__cxx11::string::~string(local_100);
          std::allocator<char>::~allocator((allocator<char> *)&local_101);
          local_e0 = uVar1;
          printf("%s -> %d bytes/element\t","CS16",uVar1 & 0xffffffff);
          if (local_e0 == 4) {
            printf("OK\n");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_130,"CU16",&local_131);
            uVar1 = SoapySDR::formatToSize(local_130);
            std::__cxx11::string::~string(local_130);
            std::allocator<char>::~allocator((allocator<char> *)&local_131);
            local_110 = uVar1;
            printf("%s -> %d bytes/element\t","CU16",uVar1 & 0xffffffff);
            if (local_110 == 4) {
              printf("OK\n");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_160,"CS12",&local_161);
              uVar1 = SoapySDR::formatToSize(local_160);
              std::__cxx11::string::~string(local_160);
              std::allocator<char>::~allocator((allocator<char> *)&local_161);
              local_140 = uVar1;
              printf("%s -> %d bytes/element\t","CS12",uVar1 & 0xffffffff);
              if (local_140 == 3) {
                printf("OK\n");
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_190,"CU12",&local_191);
                uVar1 = SoapySDR::formatToSize(local_190);
                std::__cxx11::string::~string(local_190);
                std::allocator<char>::~allocator((allocator<char> *)&local_191);
                local_170 = uVar1;
                printf("%s -> %d bytes/element\t","CU12",uVar1 & 0xffffffff);
                if (local_170 == 3) {
                  printf("OK\n");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_1c0,"CS8",&local_1c1);
                  uVar1 = SoapySDR::formatToSize(local_1c0);
                  std::__cxx11::string::~string(local_1c0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
                  local_1a0 = uVar1;
                  printf("%s -> %d bytes/element\t","CS8",uVar1 & 0xffffffff);
                  if (local_1a0 == 2) {
                    printf("OK\n");
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_1f0,"CU8",&local_1f1);
                    uVar1 = SoapySDR::formatToSize(local_1f0);
                    std::__cxx11::string::~string(local_1f0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
                    local_1d0 = uVar1;
                    printf("%s -> %d bytes/element\t","CU8",uVar1 & 0xffffffff);
                    if (local_1d0 == 2) {
                      printf("OK\n");
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_220,"CS4",&local_221);
                      uVar1 = SoapySDR::formatToSize(local_220);
                      std::__cxx11::string::~string(local_220);
                      std::allocator<char>::~allocator((allocator<char> *)&local_221);
                      local_200 = uVar1;
                      printf("%s -> %d bytes/element\t","CS4",uVar1 & 0xffffffff);
                      if (local_200 == 1) {
                        printf("OK\n");
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_250,"CU4",&local_251);
                        uVar1 = SoapySDR::formatToSize(local_250);
                        std::__cxx11::string::~string(local_250);
                        std::allocator<char>::~allocator((allocator<char> *)&local_251);
                        local_230 = uVar1;
                        printf("%s -> %d bytes/element\t","CU4",uVar1 & 0xffffffff);
                        if (local_230 == 1) {
                          printf("OK\n");
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_280,"F64",&local_281);
                          uVar1 = SoapySDR::formatToSize(local_280);
                          std::__cxx11::string::~string(local_280);
                          std::allocator<char>::~allocator((allocator<char> *)&local_281);
                          local_260 = uVar1;
                          printf("%s -> %d bytes/element\t","F64",uVar1 & 0xffffffff);
                          if (local_260 == 8) {
                            printf("OK\n");
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_2b0,"F32",&local_2b1);
                            uVar1 = SoapySDR::formatToSize(local_2b0);
                            std::__cxx11::string::~string(local_2b0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
                            local_290 = uVar1;
                            printf("%s -> %d bytes/element\t","F32",uVar1 & 0xffffffff);
                            if (local_290 == 4) {
                              printf("OK\n");
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_2e0,"S32",&local_2e1);
                              uVar1 = SoapySDR::formatToSize(local_2e0);
                              std::__cxx11::string::~string(local_2e0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
                              local_2c0 = uVar1;
                              printf("%s -> %d bytes/element\t","S32",uVar1 & 0xffffffff);
                              if (local_2c0 == 4) {
                                printf("OK\n");
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_310,"U32",&local_311);
                                uVar1 = SoapySDR::formatToSize(local_310);
                                std::__cxx11::string::~string(local_310);
                                std::allocator<char>::~allocator((allocator<char> *)&local_311);
                                local_2f0 = uVar1;
                                printf("%s -> %d bytes/element\t","U32",uVar1 & 0xffffffff);
                                if (local_2f0 == 4) {
                                  printf("OK\n");
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_340,"S16",&local_341);
                                  uVar1 = SoapySDR::formatToSize(local_340);
                                  std::__cxx11::string::~string(local_340);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_341);
                                  local_320 = uVar1;
                                  printf("%s -> %d bytes/element\t","S16",uVar1 & 0xffffffff);
                                  if (local_320 == 2) {
                                    printf("OK\n");
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_370,"U16",&local_371);
                                    uVar1 = SoapySDR::formatToSize(local_370);
                                    std::__cxx11::string::~string(local_370);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_371);
                                    local_350 = uVar1;
                                    printf("%s -> %d bytes/element\t","U16",uVar1 & 0xffffffff);
                                    if (local_350 == 2) {
                                      printf("OK\n");
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string(local_3a0,"S8",&local_3a1);
                                      uVar1 = SoapySDR::formatToSize(local_3a0);
                                      std::__cxx11::string::~string(local_3a0);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_3a1);
                                      local_380 = uVar1;
                                      printf("%s -> %d bytes/element\t","S8",uVar1 & 0xffffffff);
                                      if (local_380 == 1) {
                                        printf("OK\n");
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string(local_3d0,"U8",&local_3d1);
                                        uVar1 = SoapySDR::formatToSize(local_3d0);
                                        std::__cxx11::string::~string(local_3d0);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_3d1);
                                        local_3b0 = uVar1;
                                        printf("%s -> %d bytes/element\t","U8",uVar1 & 0xffffffff);
                                        if (local_3b0 == 1) {
                                          printf("OK\n");
                                          printf("DONE!\n");
                                          local_4 = 0;
                                        }
                                        else {
                                          printf("FAIL: expected %d bytes!\n",1);
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        printf("FAIL: expected %d bytes!\n",1);
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      printf("FAIL: expected %d bytes!\n",2);
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    printf("FAIL: expected %d bytes!\n",2);
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  printf("FAIL: expected %d bytes!\n",4);
                                  local_4 = 1;
                                }
                              }
                              else {
                                printf("FAIL: expected %d bytes!\n",4);
                                local_4 = 1;
                              }
                            }
                            else {
                              printf("FAIL: expected %d bytes!\n",4);
                              local_4 = 1;
                            }
                          }
                          else {
                            printf("FAIL: expected %d bytes!\n",8);
                            local_4 = 1;
                          }
                        }
                        else {
                          printf("FAIL: expected %d bytes!\n",1);
                          local_4 = 1;
                        }
                      }
                      else {
                        printf("FAIL: expected %d bytes!\n",1);
                        local_4 = 1;
                      }
                    }
                    else {
                      printf("FAIL: expected %d bytes!\n",2);
                      local_4 = 1;
                    }
                  }
                  else {
                    printf("FAIL: expected %d bytes!\n",2);
                    local_4 = 1;
                  }
                }
                else {
                  printf("FAIL: expected %d bytes!\n",3);
                  local_4 = 1;
                }
              }
              else {
                printf("FAIL: expected %d bytes!\n",3);
                local_4 = 1;
              }
            }
            else {
              printf("FAIL: expected %d bytes!\n",4);
              local_4 = 1;
            }
          }
          else {
            printf("FAIL: expected %d bytes!\n",4);
            local_4 = 1;
          }
        }
        else {
          printf("FAIL: expected %d bytes!\n",8);
          local_4 = 1;
        }
      }
      else {
        printf("FAIL: expected %d bytes!\n",8);
        local_4 = 1;
      }
    }
    else {
      printf("FAIL: expected %d bytes!\n",8);
      local_4 = 1;
    }
  }
  else {
    printf("FAIL: expected %d bytes!\n",0x10);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
    #define formatCheck(formatStr, expectedSize) \
    { \
        size_t bytes = SoapySDR::formatToSize(formatStr); \
        printf("%s -> %d bytes/element\t", formatStr, int(bytes)); \
        if (bytes != expectedSize) \
        { \
            printf("FAIL: expected %d bytes!\n", int(expectedSize)); \
            return EXIT_FAILURE; \
        } \
        else printf("OK\n"); \
    }

    formatCheck(SOAPY_SDR_CF64, 16);
    formatCheck(SOAPY_SDR_CF32, 8);
    formatCheck(SOAPY_SDR_CS32, 8);
    formatCheck(SOAPY_SDR_CU32, 8);
    formatCheck(SOAPY_SDR_CS16, 4);
    formatCheck(SOAPY_SDR_CU16, 4);
    formatCheck(SOAPY_SDR_CS12, 3);
    formatCheck(SOAPY_SDR_CU12, 3);
    formatCheck(SOAPY_SDR_CS8, 2);
    formatCheck(SOAPY_SDR_CU8, 2);
    formatCheck(SOAPY_SDR_CS4, 1);
    formatCheck(SOAPY_SDR_CU4, 1);

    formatCheck(SOAPY_SDR_F64, 8);
    formatCheck(SOAPY_SDR_F32, 4);
    formatCheck(SOAPY_SDR_S32, 4);
    formatCheck(SOAPY_SDR_U32, 4);
    formatCheck(SOAPY_SDR_S16, 2);
    formatCheck(SOAPY_SDR_U16, 2);
    formatCheck(SOAPY_SDR_S8, 1);
    formatCheck(SOAPY_SDR_U8, 1);

    printf("DONE!\n");
    return EXIT_SUCCESS;
}